

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O2

string * __thiscall
gmath::(anonymous_namespace)::getCameraKey_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,char *key,int id)

{
  ostream *poVar1;
  ostringstream os;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  std::operator<<((ostream *)&os,"camera.");
  if (-1 < (int)key) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&os,(int)key);
    std::operator<<(poVar1,'.');
  }
  std::operator<<((ostream *)&os,(char *)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  return __return_storage_ptr__;
}

Assistant:

std::string getCameraKey(const char *key, int id)
{
  std::ostringstream os;

  os << "camera.";

  if (id >= 0)
  {
    os << id << '.';
  }

  os << key;

  return os.str();
}